

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

void os_get_special_path(char *buf,size_t buflen,char *argv0,int id)

{
  int iVar1;
  char *__file;
  stat inf;
  stat local_b0;
  
  __file = (char *)0x0;
  switch(id) {
  case 1:
    __file = getenv("T3_RESDIR");
    if ((__file == (char *)0x0) || (*__file == '\0')) {
      __file = "/usr/local/share/frobtads/tads3/res";
    }
    break;
  case 2:
    __file = getenv("T3_INCDIR");
    if ((__file == (char *)0x0) || (*__file == '\0')) {
      __file = "/usr/local/share/frobtads/tads3/include";
    }
    break;
  case 3:
    __file = getenv("T3_LIBDIR");
    if ((__file == (char *)0x0) || (*__file == '\0')) {
      __file = "/usr/local/share/frobtads/tads3/lib";
    }
    break;
  case 4:
    __file = getenv("T3_USERLIBDIR");
    break;
  case 6:
    __file = getenv("T3_CONFIG");
    if (argv0 != (char *)0x0 && __file == (char *)0x0) {
      os_get_path_name(buf,buflen,argv0);
      return;
    }
    break;
  case 7:
    __file = getenv("T3_LOGDIR");
    if ((__file == (char *)0x0) || (*__file == '\0')) {
      __file = "/tmp/frob.log";
    }
  }
  if (((__file == (char *)0x0) || (iVar1 = stat(__file,&local_b0), iVar1 != 0)) ||
     ((local_b0.st_mode & 0xf000) != 0x4000)) {
    *buf = '\0';
  }
  else {
    strncpy(buf,__file,buflen - 1);
  }
  return;
}

Assistant:

void
os_get_special_path( char* buf, size_t buflen, const char* argv0, int id )
{
    const char* res;

    switch (id) {
      case OS_GSP_T3_RES:
        res = getenv("T3_RESDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_RES_DIR;
        }
        break;

      case OS_GSP_T3_INC:
        res = getenv("T3_INCDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_INC_DIR;
        }
        break;

      case OS_GSP_T3_LIB:
        res = getenv("T3_LIBDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_LIB_DIR;
        }
        break;

      case OS_GSP_T3_USER_LIBS:
        // There's no compile-time default for user libs.
        res = getenv("T3_USERLIBDIR");
        break;

      case OS_GSP_T3_SYSCONFIG:
        res = getenv("T3_CONFIG");
        if (res == 0 and argv0 != 0) {
            os_get_path_name(buf, buflen, argv0);
            return;
        }
        break;

      case OS_GSP_LOGFILE:
        res = getenv("T3_LOGDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_LOG_FILE;
        }
        break;

      default:
        // TODO: We could print a warning here to inform the
        // user that we're outdated.
        res = 0;
    }

    if (res != 0) {
        // Only use the detected path if it exists and is a
        // directory.
        struct stat inf;
        int statRet = stat(res, &inf);
        if (statRet == 0 and (inf.st_mode & S_IFMT) == S_IFDIR) {
            strncpy(buf, res, buflen - 1);
            return;
        }
    }
    // Indicate failure.
    buf[0] = '\0';
}